

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool __thiscall
cmInstallCommand::HandleExportMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmTargetExport *name;
  bool bVar1;
  bool exportOld_00;
  uint uVar2;
  PolicyStatus PVar3;
  MessageLevel message_00;
  const_reference pvVar4;
  ostream *poVar5;
  reference pvVar6;
  ulong uVar7;
  string *psVar8;
  long lVar9;
  cmGlobalGenerator *pcVar10;
  cmExportSetMap *this_00;
  cmExportSet *this_01;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *this_02;
  reference ppcVar11;
  cmTarget *this_03;
  cmInstallExportGenerator *this_04;
  char *destination;
  char *file_permissions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations;
  char *component;
  char *filename_00;
  char *name_space_00;
  bool local_1221;
  cmInstallExportGenerator *exportGenerator;
  undefined1 local_1198 [4];
  MessageLevel message;
  undefined1 local_1178 [8];
  ostringstream e_5;
  bool newCMP0022Behavior;
  cmTarget *tgt;
  cmTargetExport *te;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *__range2;
  cmExportSet *exportSet;
  undefined1 local_fa8 [8];
  ostringstream e_4;
  string local_e30;
  undefined1 local_e10 [8];
  ostringstream e_3;
  string local_c90;
  string local_c70;
  undefined1 local_c50 [8];
  ostringstream e_2;
  undefined1 local_ad8 [8];
  string fname;
  undefined1 local_a98 [8];
  ostringstream e_1;
  string local_918;
  undefined1 local_8f8 [8];
  ostringstream e;
  undefined1 local_780 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  cmCAString filename;
  cmCAEnabler exportOld;
  cmCAString name_space;
  cmCAString exp;
  string local_598;
  undefined1 local_578 [8];
  cmInstallCommandArguments ica;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmInstallCommand *this_local;
  
  ica.DefaultComponentName.field_2._8_8_ = args;
  std::__cxx11::string::string((string *)&local_598,(string *)&this->DefaultComponentName);
  cmInstallCommandArguments::cmInstallCommandArguments
            ((cmInstallCommandArguments *)local_578,&local_598);
  std::__cxx11::string::~string((string *)&local_598);
  cmCAString::cmCAString
            ((cmCAString *)&name_space.DataStart,(cmCommandArgumentsHelper *)local_578,"EXPORT",
             (cmCommandArgumentGroup *)0x0);
  cmCAString::cmCAString
            ((cmCAString *)&exportOld.Enabled,(cmCommandArgumentsHelper *)local_578,"NAMESPACE",
             (cmCommandArgumentGroup *)
             &ica.Parser.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cmCAEnabler::cmCAEnabler
            ((cmCAEnabler *)&filename.DataStart,(cmCommandArgumentsHelper *)local_578,
             "EXPORT_LINK_INTERFACE_LIBRARIES",
             (cmCommandArgumentGroup *)
             &ica.Parser.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cmCAString::cmCAString
            ((cmCAString *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (cmCommandArgumentsHelper *)local_578,"FILE",
             (cmCommandArgumentGroup *)
             &ica.Parser.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cmCommandArgument::Follows((cmCommandArgument *)&name_space.DataStart,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows
            ((cmCommandArgumentGroup *)
             &ica.Parser.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(cmCommandArgument *)&name_space.DataStart);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_780);
  cmInstallCommandArguments::Parse
            ((cmInstallCommandArguments *)local_578,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ica.DefaultComponentName.field_2._8_8_,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_780);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_780);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8f8);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ica.DefaultComponentName.field_2._8_8_,0);
    poVar5 = std::operator<<((ostream *)local_8f8,(string *)pvVar4);
    poVar5 = std::operator<<(poVar5," given unknown argument \"");
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_780,0);
    poVar5 = std::operator<<(poVar5,(string *)pvVar6);
    std::operator<<(poVar5,"\".");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,&local_918);
    std::__cxx11::string::~string((string *)&local_918);
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8f8);
    goto LAB_00309433;
  }
  bVar1 = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_578);
  if (!bVar1) {
    this_local._7_1_ = false;
    goto LAB_00309433;
  }
  cmInstallCommandArguments::GetDestination_abi_cxx11_((cmInstallCommandArguments *)local_578);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a98);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ica.DefaultComponentName.field_2._8_8_,0);
    poVar5 = std::operator<<((ostream *)local_a98,(string *)pvVar4);
    std::operator<<(poVar5," given no DESTINATION!");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)((long)&fname.field_2 + 8));
    std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a98);
    goto LAB_00309433;
  }
  psVar8 = cmCAString::GetString_abi_cxx11_
                     ((cmCAString *)
                      &unknownArgs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string((string *)local_ad8,(string *)psVar8);
  lVar9 = std::__cxx11::string::find_first_of(local_ad8,0x7a6815);
  if (lVar9 == -1) {
    uVar2 = std::__cxx11::string::empty();
    local_1221 = false;
    if ((uVar2 & 1) == 0) {
      cmsys::SystemTools::GetFilenameLastExtension(&local_c90,(string *)local_ad8);
      local_1221 = std::operator!=(&local_c90,".cmake");
      std::__cxx11::string::~string((string *)&local_c90);
    }
    if (local_1221 == false) {
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        psVar8 = cmCAString::GetString_abi_cxx11_((cmCAString *)&name_space.DataStart);
        std::__cxx11::string::operator=((string *)local_ad8,(string *)psVar8);
        std::__cxx11::string::operator+=((string *)local_ad8,".cmake");
        lVar9 = std::__cxx11::string::find_first_of(local_ad8,0x7a6815);
        if (lVar9 != -1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_fa8);
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)ica.DefaultComponentName.field_2._8_8_,0);
          poVar5 = std::operator<<((ostream *)local_fa8,(string *)pvVar4);
          poVar5 = std::operator<<(poVar5," given export name \"");
          psVar8 = cmCAString::GetString_abi_cxx11_((cmCAString *)&name_space.DataStart);
          poVar5 = std::operator<<(poVar5,(string *)psVar8);
          poVar5 = std::operator<<(poVar5,"\".  ");
          poVar5 = std::operator<<(poVar5,"This name cannot be safely converted to a file name.  ");
          poVar5 = std::operator<<(poVar5,
                                   "Specify a different export name or use the FILE option to set ")
          ;
          std::operator<<(poVar5,"a file name explicitly.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)&exportSet);
          std::__cxx11::string::~string((string *)&exportSet);
          this_local._7_1_ = false;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_fa8);
          goto LAB_00309417;
        }
      }
      pcVar10 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
      this_00 = cmGlobalGenerator::GetExportSets(pcVar10);
      psVar8 = cmCAString::GetString_abi_cxx11_((cmCAString *)&name_space.DataStart);
      this_01 = cmExportSetMap::operator[](this_00,psVar8);
      bVar1 = cmCAEnabler::IsEnabled((cmCAEnabler *)&filename.DataStart);
      if (bVar1) {
        this_02 = cmExportSet::GetTargetExports(this_01);
        __end2 = std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin(this_02);
        te = (cmTargetExport *)
             std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end(this_02);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                                           *)&te), bVar1) {
          ppcVar11 = __gnu_cxx::
                     __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                     ::operator*(&__end2);
          name = *ppcVar11;
          pcVar10 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
          this_03 = cmGlobalGenerator::FindTarget(pcVar10,&name->TargetName,false);
          bVar1 = false;
          if (this_03 != (cmTarget *)0x0) {
            PVar3 = cmTarget::GetPolicyStatusCMP0022(this_03);
            bVar1 = false;
            if (PVar3 != WARN) {
              PVar3 = cmTarget::GetPolicyStatusCMP0022(this_03);
              bVar1 = PVar3 != OLD;
            }
          }
          if (!bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1178);
            poVar5 = std::operator<<((ostream *)local_1178,"INSTALL(EXPORT) given keyword \"");
            poVar5 = std::operator<<(poVar5,"EXPORT_LINK_INTERFACE_LIBRARIES");
            poVar5 = std::operator<<(poVar5,"\", but target \"");
            poVar5 = std::operator<<(poVar5,(string *)name);
            std::operator<<(poVar5,"\" does not have policy CMP0022 set to NEW.");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1198);
            std::__cxx11::string::~string((string *)local_1198);
            this_local._7_1_ = false;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1178);
            goto LAB_00309417;
          }
          __gnu_cxx::
          __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
          ::operator++(&__end2);
        }
      }
      message_00 = cmInstallGenerator::SelectMessageLevel((this->super_cmCommand).Makefile,false);
      this_04 = (cmInstallExportGenerator *)operator_new(0x178);
      cmInstallCommandArguments::GetDestination_abi_cxx11_((cmInstallCommandArguments *)local_578);
      destination = (char *)std::__cxx11::string::c_str();
      cmInstallCommandArguments::GetPermissions_abi_cxx11_((cmInstallCommandArguments *)local_578);
      file_permissions = (char *)std::__cxx11::string::c_str();
      configurations =
           cmInstallCommandArguments::GetConfigurations_abi_cxx11_
                     ((cmInstallCommandArguments *)local_578);
      cmInstallCommandArguments::GetComponent_abi_cxx11_((cmInstallCommandArguments *)local_578);
      component = (char *)std::__cxx11::string::c_str();
      bVar1 = cmInstallCommandArguments::GetExcludeFromAll((cmInstallCommandArguments *)local_578);
      filename_00 = (char *)std::__cxx11::string::c_str();
      name_space_00 = cmCAString::GetCString((cmCAString *)&exportOld.Enabled);
      exportOld_00 = cmCAEnabler::IsEnabled((cmCAEnabler *)&filename.DataStart);
      cmInstallExportGenerator::cmInstallExportGenerator
                (this_04,this_01,destination,file_permissions,configurations,component,message_00,
                 bVar1,filename_00,name_space_00,exportOld_00,false);
      cmMakefile::AddInstallGenerator
                ((this->super_cmCommand).Makefile,(cmInstallGenerator *)this_04);
      this_local._7_1_ = true;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e10);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)ica.DefaultComponentName.field_2._8_8_,0);
      poVar5 = std::operator<<((ostream *)local_e10,(string *)pvVar4);
      poVar5 = std::operator<<(poVar5," given invalid export file name \"");
      poVar5 = std::operator<<(poVar5,(string *)local_ad8);
      poVar5 = std::operator<<(poVar5,"\".  ");
      std::operator<<(poVar5,"The FILE argument must specify a name ending in \".cmake\".");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_e30);
      std::__cxx11::string::~string((string *)&local_e30);
      this_local._7_1_ = false;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e10);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c50);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ica.DefaultComponentName.field_2._8_8_,0);
    poVar5 = std::operator<<((ostream *)local_c50,(string *)pvVar4);
    poVar5 = std::operator<<(poVar5," given invalid export file name \"");
    poVar5 = std::operator<<(poVar5,(string *)local_ad8);
    poVar5 = std::operator<<(poVar5,"\".  ");
    poVar5 = std::operator<<(poVar5,"The FILE argument may not contain a path.  ");
    std::operator<<(poVar5,"Specify the path in the DESTINATION argument.");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,&local_c70);
    std::__cxx11::string::~string((string *)&local_c70);
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c50);
  }
LAB_00309417:
  std::__cxx11::string::~string((string *)local_ad8);
LAB_00309433:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_780);
  cmCAString::~cmCAString
            ((cmCAString *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmCAEnabler::~cmCAEnabler((cmCAEnabler *)&filename.DataStart);
  cmCAString::~cmCAString((cmCAString *)&exportOld.Enabled);
  cmCAString::~cmCAString((cmCAString *)&name_space.DataStart);
  cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_578);
  return this_local._7_1_;
}

Assistant:

bool cmInstallCommand::HandleExportMode(std::vector<std::string> const& args)
{
  // This is the EXPORT mode.
  cmInstallCommandArguments ica(this->DefaultComponentName);
  cmCAString exp(&ica.Parser, "EXPORT");
  cmCAString name_space(&ica.Parser, "NAMESPACE", &ica.ArgumentGroup);
  cmCAEnabler exportOld(&ica.Parser, "EXPORT_LINK_INTERFACE_LIBRARIES",
                        &ica.ArgumentGroup);
  cmCAString filename(&ica.Parser, "FILE", &ica.ArgumentGroup);
  exp.Follows(nullptr);

  ica.ArgumentGroup.Follows(&exp);
  std::vector<std::string> unknownArgs;
  ica.Parse(&args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    std::ostringstream e;
    e << args[0] << " given unknown argument \"" << unknownArgs[0] << "\".";
    this->SetError(e.str());
    return false;
  }

  if (!ica.Finalize()) {
    return false;
  }

  // Make sure there is a destination.
  if (ica.GetDestination().empty()) {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
  }

  // Check the file name.
  std::string fname = filename.GetString();
  if (fname.find_first_of(":/\\") != std::string::npos) {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument may not contain a path.  "
      << "Specify the path in the DESTINATION argument.";
    this->SetError(e.str());
    return false;
  }

  // Check the file extension.
  if (!fname.empty() &&
      cmSystemTools::GetFilenameLastExtension(fname) != ".cmake") {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument must specify a name ending in \".cmake\".";
    this->SetError(e.str());
    return false;
  }

  // Construct the file name.
  if (fname.empty()) {
    fname = exp.GetString();
    fname += ".cmake";

    if (fname.find_first_of(":/\\") != std::string::npos) {
      std::ostringstream e;
      e << args[0] << " given export name \"" << exp.GetString() << "\".  "
        << "This name cannot be safely converted to a file name.  "
        << "Specify a different export name or use the FILE option to set "
        << "a file name explicitly.";
      this->SetError(e.str());
      return false;
    }
  }

  cmExportSet* exportSet =
    this->Makefile->GetGlobalGenerator()->GetExportSets()[exp.GetString()];
  if (exportOld.IsEnabled()) {
    for (cmTargetExport* te : *exportSet->GetTargetExports()) {
      cmTarget* tgt =
        this->Makefile->GetGlobalGenerator()->FindTarget(te->TargetName);
      const bool newCMP0022Behavior =
        (tgt && tgt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
         tgt->GetPolicyStatusCMP0022() != cmPolicies::OLD);

      if (!newCMP0022Behavior) {
        std::ostringstream e;
        e << "INSTALL(EXPORT) given keyword \""
          << "EXPORT_LINK_INTERFACE_LIBRARIES"
          << "\", but target \"" << te->TargetName
          << "\" does not have policy CMP0022 set to NEW.";
        this->SetError(e.str());
        return false;
      }
    }
  }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile);

  // Create the export install generator.
  cmInstallExportGenerator* exportGenerator = new cmInstallExportGenerator(
    exportSet, ica.GetDestination().c_str(), ica.GetPermissions().c_str(),
    ica.GetConfigurations(), ica.GetComponent().c_str(), message,
    ica.GetExcludeFromAll(), fname.c_str(), name_space.GetCString(),
    exportOld.IsEnabled(), false);
  this->Makefile->AddInstallGenerator(exportGenerator);

  return true;
}